

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall psy::C::Parser::parseExtGNU_Attribute(Parser *this,ExtGNU_AttributeSyntax **attr)

{
  SyntaxKind SVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  SyntaxToken *pSVar5;
  ExtGNU_AttributeSyntax *pEVar6;
  IndexType IVar7;
  code *pcVar8;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_31;
  SyntaxKind local_30 [4];
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_28;
  
  pSVar5 = peek(this,1);
  SVar1 = pSVar5->syntaxK_;
  if (SVar1 != IdentifierToken) {
    if ((SVar1 == CloseParenToken) || (SVar1 == CommaToken)) {
      pEVar6 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
      *attr = pEVar6;
      return true;
    }
    if (SVar1 != KeywordAlias___const) {
      local_30[0] = IdentifierToken;
      local_30[1] = KeywordAlias___const;
      local_30[2] = CommaToken;
      local_30[3] = CloseParenToken;
      __l._M_len = 4;
      __l._M_array = local_30;
      std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
                ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_28,__l,
                 &local_31);
      DiagnosticsReporter::ExpectedTokenWithin
                (&this->diagReporter_,
                 (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_28);
      std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
                (&local_28);
      return false;
    }
  }
  pEVar6 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
  *attr = pEVar6;
  IVar7 = consume(this);
  (*attr)->kwOrIdentTkIdx_ = IVar7;
  pSVar5 = peek(this,1);
  if (pSVar5->syntaxK_ != OpenParenToken) {
    return true;
  }
  IVar7 = consume(this);
  pEVar6 = *attr;
  pEVar6->openParenTkIdx_ = IVar7;
  pSVar5 = SyntaxTree::tokenAt(this->tree_,pEVar6->kwOrIdentTkIdx_);
  if (((pSVar5->field_10).identifier_ == (Identifier *)0x0) ||
     (iVar4 = strcmp(*(char **)&(((pSVar5->field_10).identifier_)->super_Lexeme).field_0x10,
                     "availability"), iVar4 != 0)) {
    pcVar8 = parseExtGNU_AttributeArguments;
  }
  else {
    pcVar8 = parseExtGNU_AttributeArgumentsLLVM;
  }
  cVar2 = (*pcVar8)(this,&(*attr)->exprs_);
  if (cVar2 == '\0') {
    return false;
  }
  bVar3 = matchOrSkipTo(this,CloseParenToken,&(*attr)->closeParenTkIdx_);
  return bVar3;
}

Assistant:

bool Parser::parseExtGNU_Attribute(ExtGNU_AttributeSyntax*& attr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        case SyntaxKind::IdentifierToken:
        case SyntaxKind::Keyword_const:
            attr = makeNode<ExtGNU_AttributeSyntax>();
            attr->kwOrIdentTkIdx_ = consume();
            break;

        case SyntaxKind::CommaToken:
        case SyntaxKind::CloseParenToken:
            // An empty attribute is valid.
            attr = makeNode<ExtGNU_AttributeSyntax>();
            return true;

        default:
            diagReporter_.ExpectedTokenWithin(
                { SyntaxKind::IdentifierToken,
                  SyntaxKind::Keyword_const,
                  SyntaxKind::CommaToken,
                  SyntaxKind::CloseParenToken });
            return false;
    }

    if (peek().kind() != SyntaxKind::OpenParenToken)
        return true;

    attr->openParenTkIdx_ = consume();

    auto ident = tree_->tokenAt(attr->kwOrIdentTkIdx_).identifier_;
    bool (Parser::*parseAttrArg)(ExpressionListSyntax*&);
    if (ident && !strcmp(ident->c_str(), "availability"))
        parseAttrArg = &Parser::parseExtGNU_AttributeArgumentsLLVM;
    else
        parseAttrArg = &Parser::parseExtGNU_AttributeArguments;

    return ((this->*(parseAttrArg))(attr->exprs_))
        && matchOrSkipTo(SyntaxKind::CloseParenToken, &attr->closeParenTkIdx_);
}